

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_cepstral_analysis.cc
# Opt level: O0

bool __thiscall
sptk::MelCepstralAnalysis::Run
          (MelCepstralAnalysis *this,vector<double,_std::allocator<double>_> *periodogram,
          vector<double,_std::allocator<double>_> *mel_cepstrum,Buffer *buffer)

{
  RealValuedFastFourierTransform *pRVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  iterator iVar7;
  reference pvVar8;
  iterator iVar9;
  iterator this_00;
  iterator toeplitz_coefficient_vector;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> constant_vector;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> solution_vector;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var10;
  iterator iVar11;
  int iVar12;
  long in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double relative_change;
  double epsilon;
  int n;
  double prev_epsilon;
  int length;
  int half_fft_length;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffde0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffde8;
  iterator in_stack_fffffffffffffdf8;
  iterator in_stack_fffffffffffffe00;
  iterator in_stack_fffffffffffffe08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe10;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe48;
  iterator in_stack_fffffffffffffe50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe58;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe70;
  iterator in_stack_fffffffffffffe78;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe80;
  iterator in_stack_fffffffffffffe90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffeb0;
  RealValuedFastFourierTransform *in_stack_fffffffffffffeb8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff08;
  int local_c4;
  RealValuedFastFourierTransform *local_c0;
  bool local_1;
  
  iVar12 = *(int *)&(((vector<double,_std::allocator<double>_> *)in_RDI._M_current)->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish / 2;
  if ((((((ulong)(((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x150))->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start & 1) == 0) ||
       (sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar4 != (long)(iVar12 + 1))) || (in_RDX == (vector<double,_std::allocator<double>_> *)0x0))
     || (in_RCX == 0)) {
    local_1 = false;
  }
  else {
    iVar3 = *(int *)((long)&(((vector<double,_std::allocator<double>_> *)in_RDI._M_current)->
                            super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_finish + 4) + 1;
    sVar4 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar4 != (long)iVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
    if (sVar4 != (long)(iVar12 + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20));
    if (sVar4 != (long)*(int *)&(((vector<double,_std::allocator<double>_> *)in_RDI._M_current)->
                                super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_finish) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x98));
    if (sVar4 != (long)(iVar3 * 2 + -1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0xb0));
    if (sVar4 != (long)(iVar3 * 2 + -1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 200));
    if (sVar4 != (long)iVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0xe0));
    if (sVar4 != (long)iVar3) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
    }
    cVar5 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
    cVar6 = std::vector<double,_std::allocator<double>_>::end(in_RDI._M_current);
    iVar7 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::MelCepstralAnalysis::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::MelCepstralAnalysis::Buffer*)const::__0>
              (cVar5._M_current,cVar6._M_current,iVar7._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    std::
    copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffe08._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffe00._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               in_stack_fffffffffffffdf8._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffde8._M_current,
               (difference_type)in_stack_fffffffffffffde0._M_current);
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator-
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffde8._M_current,
               (difference_type)in_stack_fffffffffffffde0._M_current);
    std::vector<double,_std::allocator<double>_>::begin
              ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffde8._M_current,
               (difference_type)in_stack_fffffffffffffde0._M_current);
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::operator+
              ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
               in_stack_fffffffffffffde8._M_current,
               (difference_type)in_stack_fffffffffffffde0._M_current);
    std::
    reverse_copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_RDI);
    bVar2 = RealValuedInverseFastFourierTransform::Run
                      ((RealValuedInverseFastFourierTransform *)in_stack_fffffffffffffe68._M_current
                       ,(vector<double,_std::allocator<double>_> *)
                        in_stack_fffffffffffffe60._M_current,
                       (vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffe58._M_current,
                       (vector<double,_std::allocator<double>_> *)
                       in_stack_fffffffffffffe50._M_current,
                       (Buffer *)in_stack_fffffffffffffe48._M_current);
    if (bVar2) {
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
      *pvVar8 = *pvVar8 * 0.5;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),(long)iVar12);
      *pvVar8 = *pvVar8 * 0.5;
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current,
                 (size_type)in_stack_fffffffffffffdf8._M_current);
      bVar2 = FrequencyTransform::Run
                        ((FrequencyTransform *)in_stack_fffffffffffffea8._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffea0._M_current,
                         (vector<double,_std::allocator<double>_> *)
                         in_stack_fffffffffffffe98._M_current,
                         (Buffer *)in_stack_fffffffffffffe90._M_current);
      if (bVar2) {
        local_c0 = (RealValuedFastFourierTransform *)0x7fefffffffffffff;
        for (local_c4 = 0;
            local_c4 <
            *(int *)&(((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18))
                     ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start; local_c4 = local_c4 + 1) {
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe00._M_current
                     ,(size_type)in_stack_fffffffffffffdf8._M_current);
          bVar2 = FrequencyTransform::Run
                            ((FrequencyTransform *)in_stack_fffffffffffffea8._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffea0._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe98._M_current,
                             (Buffer *)in_stack_fffffffffffffe90._M_current);
          if (!bVar2) {
            return false;
          }
          std::vector<double,_std::allocator<double>_>::resize
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe10._M_current
                     ,(size_type)in_stack_fffffffffffffe08._M_current,
                     in_stack_fffffffffffffe00._M_current);
          bVar2 = RealValuedFastFourierTransform::Run
                            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffea8._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffea0._M_current,
                             (Buffer *)in_stack_fffffffffffffe98._M_current);
          if (!bVar2) {
            return false;
          }
          iVar7 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          iVar9 = std::vector<double,_std::allocator<double>_>::end(in_RDI._M_current);
          this_00 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          toeplitz_coefficient_vector =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          constant_vector =
               std::
               transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::MelCepstralAnalysis::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,sptk::MelCepstralAnalysis::Buffer*)const::__1>
                         (iVar7._M_current,iVar9._M_current,this_00._M_current,
                          toeplitz_coefficient_vector._M_current);
          iVar7 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          solution_vector =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_stack_fffffffffffffde8._M_current,
                    (difference_type)in_stack_fffffffffffffde0._M_current);
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_stack_fffffffffffffde8._M_current,
                    (difference_type)in_stack_fffffffffffffde0._M_current);
          __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
          operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                    in_stack_fffffffffffffde8._M_current,
                    (difference_type)in_stack_fffffffffffffde0._M_current);
          std::
          reverse_copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                    (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_RDI);
          bVar2 = RealValuedInverseFastFourierTransform::Run
                            ((RealValuedInverseFastFourierTransform *)
                             in_stack_fffffffffffffe68._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe60._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe58._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             in_stack_fffffffffffffe50._M_current,
                             (Buffer *)in_stack_fffffffffffffe48._M_current);
          if (!bVar2) {
            return false;
          }
          anon_unknown.dwarf_5e667::CoefficientsFrequencyTransform
                    ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80._M_current
                     ,(int)((ulong)in_stack_fffffffffffffe78._M_current >> 0x20),
                     (int)in_stack_fffffffffffffe78._M_current,
                     (double)in_stack_fffffffffffffe70._M_current,
                     (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe68._M_current
                     ,(vector<double,_std::allocator<double>_> *)
                      in_stack_fffffffffffffe60._M_current);
          pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x98),0);
          pRVar1 = (RealValuedFastFourierTransform *)*pvVar8;
          in_stack_fffffffffffffeb0 =
               (vector<double,_std::allocator<double>_> *)
               (((double)pRVar1 - (double)local_c0) / (double)pRVar1);
          if (ABS((double)in_stack_fffffffffffffeb0) <
              (double)(((vector<double,_std::allocator<double>_> *)((long)in_RDI._M_current + 0x18))
                      ->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_finish) break;
          in_stack_fffffffffffffeb8 = pRVar1;
          in_stack_fffffffffffffea0 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffea8 =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          in_stack_fffffffffffffe90 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe98 =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
          in_stack_fffffffffffffe80 =
               std::
               reverse_copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,in_RDI);
          in_stack_fffffffffffffe78 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe68 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe70 =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          in_stack_fffffffffffffe50 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe58 =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          in_stack_fffffffffffffe60 =
               __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator-(in_stack_fffffffffffffde8._M_current,in_stack_fffffffffffffde0._M_current
                          );
          in_stack_fffffffffffffe48 =
               std::
               copy<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                         (in_stack_fffffffffffffe08._M_current,in_stack_fffffffffffffe00._M_current,
                          in_stack_fffffffffffffdf8._M_current);
          iVar9 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          std::vector<double,_std::allocator<double>_>::begin
                    ((vector<double,_std::allocator<double>_> *)in_RDI._M_current);
          _Var10 = __gnu_cxx::
                   __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                   operator+(in_stack_fffffffffffffde8._M_current,
                             in_stack_fffffffffffffde0._M_current);
          cVar5 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          iVar11 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe10 =
               std::
               transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                         (iVar9._M_current,_Var10._M_current,cVar5._M_current,iVar11._M_current);
          bVar2 = ToeplitzPlusHankelSystemSolver::Run
                            ((ToeplitzPlusHankelSystemSolver *)this_00._M_current,
                             (vector<double,_std::allocator<double>_> *)
                             toeplitz_coefficient_vector._M_current,in_stack_ffffffffffffff08,
                             (vector<double,_std::allocator<double>_> *)constant_vector._M_current,
                             (vector<double,_std::allocator<double>_> *)solution_vector._M_current,
                             (Buffer *)iVar7._M_current);
          if (!bVar2) {
            return false;
          }
          in_stack_fffffffffffffe08 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffe00 =
               std::vector<double,_std::allocator<double>_>::end(in_RDI._M_current);
          in_stack_fffffffffffffdf8 =
               std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          iVar7 = std::vector<double,_std::allocator<double>_>::begin(in_RDI._M_current);
          in_stack_fffffffffffffde0 =
               std::
               transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                         (in_stack_fffffffffffffe08._M_current,in_stack_fffffffffffffe00._M_current,
                          in_stack_fffffffffffffdf8._M_current,iVar7._M_current);
          local_c0 = pRVar1;
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool MelCepstralAnalysis::Run(const std::vector<double>& periodogram,
                              std::vector<double>* mel_cepstrum,
                              MelCepstralAnalysis::Buffer* buffer) const {
  // Check inputs.
  const int half_fft_length(fft_length_ / 2);
  if (!is_valid_ ||
      periodogram.size() != static_cast<std::size_t>(half_fft_length + 1) ||
      NULL == mel_cepstrum || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int length(num_order_ + 1);
  if (mel_cepstrum->size() != static_cast<std::size_t>(length)) {
    mel_cepstrum->resize(length);
  }
  if (buffer->log_periodogram_.size() !=
      static_cast<std::size_t>(half_fft_length + 1)) {
    buffer->log_periodogram_.resize(half_fft_length + 1);
  }
  if (buffer->cepstrum_.size() != static_cast<std::size_t>(fft_length_)) {
    buffer->cepstrum_.resize(fft_length_);
  }
  if (buffer->rt_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rt_.resize(2 * length - 1);
  }
  if (buffer->rr_.size() != static_cast<std::size_t>(2 * length - 1)) {
    buffer->rr_.resize(2 * length - 1);
  }
  if (buffer->ra_.size() != static_cast<std::size_t>(length)) {
    buffer->ra_.resize(length);
  }
  if (buffer->gradient_.size() != static_cast<std::size_t>(length)) {
    buffer->gradient_.resize(length);
  }

  // Make an initial guess.
  {
    std::transform(periodogram.begin(), periodogram.end(),
                   buffer->log_periodogram_.begin(),
                   [](double p) { return std::log(p); });

    // \log I_N -> c
    std::copy(buffer->log_periodogram_.begin(), buffer->log_periodogram_.end(),
              buffer->cepstrum_.begin());
    std::reverse_copy(buffer->log_periodogram_.begin() + 1,
                      buffer->log_periodogram_.end() - 1,
                      buffer->cepstrum_.begin() + half_fft_length + 1);
    if (!inverse_fourier_transform_.Run(
            buffer->cepstrum_, &buffer->cepstrum_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }
    buffer->cepstrum_[0] *= 0.5;
    buffer->cepstrum_[half_fft_length] *= 0.5;

    // c -> \tilde{c}
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!frequency_transform_.Run(buffer->cepstrum_, mel_cepstrum,
                                  &buffer->buffer_for_frequency_transform_)) {
      return false;
    }
  }

  // Perform Newton-Raphson method.
  double prev_epsilon(sptk::kMax);
  for (int n(0); n < num_iteration_; ++n) {
    // \tilde{c} -> c
    buffer->cepstrum_.resize(half_fft_length + 1);
    if (!inverse_frequency_transform_.Run(
            *mel_cepstrum, &buffer->cepstrum_,
            &buffer->buffer_for_inverse_frequency_transform_)) {
      return false;
    }

    // c -> \log D
    buffer->cepstrum_.resize(fft_length_, 0.0);
    if (!fourier_transform_.Run(buffer->cepstrum_, &buffer->d_,
                                &buffer->imag_part_output_,
                                &buffer->buffer_for_fourier_transform_)) {
      return false;
    }

    // \log D -> I_N / |D|^2
    std::transform(buffer->log_periodogram_.begin(),
                   buffer->log_periodogram_.end(), buffer->d_.begin(),
                   buffer->d_.begin(),
                   [](double x, double d) { return std::exp(x - d - d); });
    std::reverse_copy(buffer->d_.begin() + 1,
                      buffer->d_.begin() + half_fft_length,
                      buffer->d_.begin() + half_fft_length + 1);

    // I_N / |D|^2 -> r
    if (!inverse_fourier_transform_.Run(
            buffer->d_, &buffer->r_, &buffer->imag_part_output_,
            &buffer->buffer_for_inverse_fourier_transform_)) {
      return false;
    }

    // r -> \tilde{r}
    CoefficientsFrequencyTransform(buffer->r_, half_fft_length + 1,
                                   2 * length - 1, alpha_, &buffer->rt_,
                                   &buffer->b_);

    // Check convergence.
    // (Note that the check can be done after updating mel-cepstrum, but to
    // retain the compatibility with SPTK3, this block is written here)
    {
      const double epsilon(buffer->rt_[0]);
      const double relative_change((epsilon - prev_epsilon) / epsilon);
      if (std::fabs(relative_change) < convergence_threshold_) {
        break;
      }
      prev_epsilon = epsilon;
    }

    // \tilde{r} -> R
    std::reverse_copy(buffer->rt_.begin() + 1, buffer->rt_.begin() + length,
                      buffer->rr_.begin());
    std::copy(buffer->rt_.begin(), buffer->rt_.begin() + length,
              buffer->rr_.begin() + length - 1);

    // \tilde{r} -> \tilde{r} - a
    std::transform(buffer->rt_.begin(), buffer->rt_.begin() + length,
                   alpha_vector_.begin(), buffer->ra_.begin(),
                   std::minus<double>());

    // Compute \Delta \tilde{c}.
    if (!toeplitz_plus_hankel_system_solver_.Run(
            buffer->rr_, buffer->rt_, buffer->ra_, &buffer->gradient_,
            &buffer->buffer_for_system_solver_)) {
      return false;
    }

    // Update \tilde{c}.
    std::transform(mel_cepstrum->begin(), mel_cepstrum->end(),
                   buffer->gradient_.begin(), mel_cepstrum->begin(),
                   std::plus<double>());
  }

  return true;
}